

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_terminate(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  int iVar1;
  h264_cabac_context *in_RDX;
  bitstream *in_RSI;
  int *in_RDI;
  uint32_t in_stack_ffffffffffffffdc;
  
  *(int *)&in_RSI[0x25].field_0x4 = *(int *)&in_RSI[0x25].field_0x4 + -2;
  if (*in_RDI == 0) {
    if (*(int *)&in_RDX->slice == 0) {
      iVar1 = h264_cabac_renorm(in_RSI,in_RDX);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      in_RSI[0x25].dir = *(int *)&in_RSI[0x25].field_0x4 + in_RSI[0x25].dir;
      *(undefined4 *)&in_RSI[0x25].field_0x4 = 2;
      iVar1 = h264_cabac_renorm(in_RSI,in_RDX);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = put_bit(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = put_bit(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = put_bit(in_RSI,in_RDX,in_stack_ffffffffffffffdc);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else if (in_RSI[0x25].dir < *(vs_dir *)&in_RSI[0x25].field_0x4) {
    *(undefined4 *)&in_RDX->slice = 0;
    iVar1 = h264_cabac_renorm(in_RSI,in_RDX);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    *(undefined4 *)&in_RDX->slice = 1;
  }
  in_RSI[0x25].bytesnum = in_RSI[0x25].bytesnum + 1;
  return 0;
}

Assistant:

int h264_cabac_terminate(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	cabac->codIRange -= 2;
	if (str->dir == VS_ENCODE) {
		if (*binVal) {
			cabac->codIOffset += cabac->codIRange;
			/* end of the road */
			cabac->codIRange = 2;
			if (h264_cabac_renorm(str, cabac))
				return 1;
			if (put_bit(str, cabac, cabac->codIOffset >> 9 & 1))
				return 1;
			if (put_bit(str, cabac, cabac->codIOffset >> 8 & 1))
				return 1;
			if (put_bit(str, cabac, 1)) /* the last bit, doubling as RBSP terminator if terminating due to end of slice */
				return 1;
		} else {
			if (h264_cabac_renorm(str, cabac))
				return 1;
		}
	} else {
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = 1;
		} else {
			*binVal = 0;
			if (h264_cabac_renorm(str, cabac))
				return 1;
		}
	}
	cabac->BinCount++;
	return 0;
}